

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEC.h
# Opt level: O0

Estimates * SEC(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  pointer *this;
  _Bit_pointer *this_00;
  EdgeInfo e_struct_00;
  result_type_conflict1 rVar1;
  size_type sVar2;
  reference pvVar3;
  EdgeIdx EVar4;
  EdgeIdx EVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  byte bVar9;
  reference rVar10;
  iterator iVar11;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  bool local_3e61;
  _Bit_type *local_3e60;
  uint local_3e58;
  _Bit_type *local_3e50;
  uint local_3e48;
  _Bit_type *local_3e40;
  uint local_3e38;
  _Bit_type *local_3e30;
  uint local_3e28;
  difference_type local_3e20;
  VertexIdx vertices_seen;
  _Bit_type *local_3e10;
  uint local_3e08;
  _Bit_type *local_3e00;
  uint local_3df8;
  _Bit_type *local_3df0;
  uint local_3de8;
  _Bit_type *local_3de0;
  uint local_3dd8;
  difference_type local_3dd0;
  VertexIdx edges_seen;
  double triangleEstimate;
  double scale;
  _Bit_type local_3db0;
  size_type local_3da8;
  EdgeIdx e2;
  _Bit_type local_3d98;
  reference local_3d90;
  size_type local_3d80;
  EdgeIdx idx;
  VertexIdx dst;
  VertexIdx src;
  VertexIdx VStack_3d60;
  EdgeIdx local_3d58;
  VertexIdx local_3d48;
  VertexIdx child;
  VertexIdx parent;
  EdgeInfo e_struct;
  VertexIdx i;
  EdgeIdx total_edge;
  int no_of_samples;
  int sparsity;
  OrderedEdgeCollection local_3c60;
  undefined1 local_3be8 [8];
  Estimates edge_count_output;
  OrderedEdgeCollection local_2840;
  undefined1 local_27c8 [8];
  mt19937 mt;
  undefined1 local_1430 [8];
  random_device rd;
  double dStack_a0;
  int skip;
  double edge_estimate;
  double running_count;
  OrderedEdgeCollection randomEdgeCollection;
  Parameters *params_local;
  CGraph *cg_local;
  
  bVar9 = 0;
  randomEdgeCollection.no_of_query = (VertexIdx)params;
  OrderedEdgeCollection::OrderedEdgeCollection((OrderedEdgeCollection *)&running_count);
  edge_estimate = 0.0;
  rd.field_0._M_mt._M_p._4_4_ = 1;
  std::random_device::random_device((random_device *)local_1430);
  rVar1 = std::random_device::operator()((random_device *)local_1430);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_27c8,(ulong)rVar1);
  memcpy(&edge_count_output.query_complexity,local_27c8,5000);
  pdVar7 = &edge_count_output.query_complexity;
  pdVar8 = (double *)&stack0xffffffffffffad58;
  for (lVar6 = 0x271; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pdVar8 = *pdVar7;
    pdVar7 = pdVar7 + (ulong)bVar9 * -2 + 1;
    pdVar8 = pdVar8 + (ulong)bVar9 * -2 + 1;
  }
  GetEdgesByUniSampling(&local_2840,cg,params);
  OrderedEdgeCollection::operator=((OrderedEdgeCollection *)&running_count,&local_2840);
  OrderedEdgeCollection::~OrderedEdgeCollection(&local_2840);
  if ((params->normalization_count_available & 1U) == 0) {
    OrderedEdgeCollection::OrderedEdgeCollection
              (&local_3c60,(OrderedEdgeCollection *)&running_count);
    Parameters::Parameters((Parameters *)&no_of_samples,params);
    EstimateEdgeCount((Estimates *)local_3be8,cg,&local_3c60,(Parameters *)&no_of_samples,
                      rd.field_0._M_mt._M_p._4_4_);
    Parameters::~Parameters((Parameters *)&no_of_samples);
    OrderedEdgeCollection::~OrderedEdgeCollection(&local_3c60);
    dStack_a0 = (double)local_3be8;
  }
  else {
    dStack_a0 = (double)cg->nEdges * 1.0;
  }
  total_edge._0_4_ = 0;
  sVar2 = std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::size
                    ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&randomEdgeCollection);
  for (e_struct.index = 0; e_struct.index < (long)sVar2; e_struct.index = e_struct.index + 500) {
    pvVar3 = std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::operator[]
                       ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&randomEdgeCollection,
                        e_struct.index);
    child = pvVar3->u;
    pvVar3 = std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::operator[]
                       ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&randomEdgeCollection,
                        e_struct.index);
    local_3d48 = pvVar3->v;
    pvVar3 = std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::operator[]
                       ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&randomEdgeCollection,
                        e_struct.index);
    local_3d58 = pvVar3->index;
    parent = child;
    e_struct.src = local_3d48;
    src = child;
    VStack_3d60 = local_3d48;
    e_struct_00.dest = local_3d48;
    e_struct_00.src = child;
    e_struct_00.index = local_3d58;
    e_struct.dest = local_3d58;
    EVar4 = TriangleByEdge(cg,e_struct_00);
    edge_estimate = edge_estimate + (double)EVar4;
    total_edge._0_4_ = (int)total_edge + 1;
    EVar4 = Escape::CGraph::degree(cg,child);
    EVar5 = Escape::CGraph::degree(cg,local_3d48);
    if (EVar5 < EVar4) {
      dst = local_3d48;
      idx = child;
    }
    else {
      dst = child;
      idx = local_3d48;
    }
    for (local_3d80 = cg->offsets[dst]; (long)local_3d80 < cg->offsets[dst + 1];
        local_3d80 = local_3d80 + 1) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          &randomEdgeCollection.visited_edge_set.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage,cg->nbors[local_3d80]);
      local_3d90 = rVar10;
      std::_Bit_reference::operator=(&local_3d90,true);
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          &randomEdgeCollection.edge_list.
                           super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,local_3d80);
      local_3d98 = rVar10._M_mask;
      e2 = (EdgeIdx)rVar10._M_p;
      std::_Bit_reference::operator=((_Bit_reference *)&e2,true);
      local_3da8 = Escape::CGraph::getEdgeBinary(cg,cg->nbors[local_3d80],idx);
      if (local_3da8 != 0xffffffffffffffff) {
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            &randomEdgeCollection.edge_list.
                             super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,local_3da8);
        local_3db0 = rVar10._M_mask;
        scale = (double)rVar10._M_p;
        std::_Bit_reference::operator=((_Bit_reference *)&scale,true);
      }
      randomEdgeCollection.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage =
           (_Bit_pointer)
           ((long)randomEdgeCollection.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                  ._M_impl.super__Bvector_impl_data._M_end_of_storage + 2);
    }
  }
  triangleEstimate = dStack_a0 / ((double)(int)total_edge * 6.0);
  edges_seen = (VertexIdx)(edge_estimate * triangleEstimate);
  __return_storage_ptr__->estimate = 0.0;
  __return_storage_ptr__->fraction_of_vertices_seen = 1.0;
  __return_storage_ptr__->fraction_of_edges_seen = 1.0;
  __return_storage_ptr__->query_complexity = 1.0;
  __return_storage_ptr__->estimate = (double)edges_seen;
  this = &randomEdgeCollection.edge_list.
          super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  iVar11 = std::vector<bool,_std::allocator<bool>_>::begin
                     ((vector<bool,_std::allocator<bool>_> *)this);
  local_3df0 = iVar11.super__Bit_iterator_base._M_p;
  local_3de8 = iVar11.super__Bit_iterator_base._M_offset;
  local_3de0 = local_3df0;
  local_3dd8 = local_3de8;
  iVar11 = std::vector<bool,_std::allocator<bool>_>::end
                     ((vector<bool,_std::allocator<bool>_> *)this);
  local_3e10 = iVar11.super__Bit_iterator_base._M_p;
  local_3e08 = iVar11.super__Bit_iterator_base._M_offset;
  vertices_seen._7_1_ = 1;
  __first.super__Bit_iterator_base._M_offset = local_3dd8;
  __first.super__Bit_iterator_base._M_p = local_3de0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar11.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar11.super__Bit_iterator_base._0_12_,8);
  __first.super__Bit_iterator_base._12_4_ = 0;
  local_3e00 = local_3e10;
  local_3df8 = local_3e08;
  local_3dd0 = std::count<std::_Bit_iterator,bool>
                         (__first,__last,(bool *)((long)&vertices_seen + 7));
  this_00 = &randomEdgeCollection.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_end_of_storage;
  iVar11 = std::vector<bool,_std::allocator<bool>_>::begin
                     ((vector<bool,_std::allocator<bool>_> *)this_00);
  local_3e40 = iVar11.super__Bit_iterator_base._M_p;
  local_3e38 = iVar11.super__Bit_iterator_base._M_offset;
  local_3e30 = local_3e40;
  local_3e28 = local_3e38;
  iVar11 = std::vector<bool,_std::allocator<bool>_>::end
                     ((vector<bool,_std::allocator<bool>_> *)this_00);
  local_3e60 = iVar11.super__Bit_iterator_base._M_p;
  local_3e58 = iVar11.super__Bit_iterator_base._M_offset;
  local_3e61 = true;
  __first_00.super__Bit_iterator_base._M_offset = local_3e28;
  __first_00.super__Bit_iterator_base._M_p = local_3e30;
  __last_00.super__Bit_iterator_base._12_4_ = 0;
  __last_00.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar11.super__Bit_iterator_base._0_12_,0);
  __last_00.super__Bit_iterator_base._M_offset = SUB124(iVar11.super__Bit_iterator_base._0_12_,8);
  __first_00.super__Bit_iterator_base._12_4_ = 0;
  local_3e50 = local_3e60;
  local_3e48 = local_3e58;
  local_3e20 = std::count<std::_Bit_iterator,bool>(__first_00,__last_00,&local_3e61);
  __return_storage_ptr__->fraction_of_vertices_seen =
       ((double)local_3e20 * 100.0) / (double)cg->nVertices;
  __return_storage_ptr__->fraction_of_edges_seen = ((double)local_3dd0 * 100.0) / (double)cg->nEdges
  ;
  __return_storage_ptr__->query_complexity =
       ((double)(long)randomEdgeCollection.visited_vertex_set.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_end_of_storage * 100.0) / (double)cg->nEdges;
  std::random_device::~random_device((random_device *)local_1430);
  OrderedEdgeCollection::~OrderedEdgeCollection((OrderedEdgeCollection *)&running_count);
  return __return_storage_ptr__;
}

Assistant:

Estimates SEC(CGraph *cg, Parameters params)
{
    /**
    * Set up local variables. skip parameter is used in estimating the number of edges in the graph.
    */
    OrderedEdgeCollection randomEdgeCollection;
    double running_count = 0.0, edge_estimate=0.0;
    int skip = 1;

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Perform a random walk through the graph, and collect the edges in the process
     * The fourth parameter is set to false to indicate that we do not care about the
     * vertex ordering of each edge
     */
    randomEdgeCollection = GetEdgesByUniSampling(cg, params, mt);

    /**
     * Depending on whether the total number of edges in the graphs is available or not, compute it.
     */
    if (!params.normalization_count_available) {
        Estimates edge_count_output = EstimateEdgeCount(cg, randomEdgeCollection, params, skip);
        edge_estimate = edge_count_output.estimate;
    }
    else
        edge_estimate = cg->nEdges *1.0;

    /** We now go over the edges collected by the random walk and count the
     * number of triangles incident on each edge.
     * However, we can not do this for every edge as it would be too expensive.
     * Instead, we perform this task for a small fraction of the total edges in the random walk
     */
    int sparsity = 500, no_of_samples=0;
    EdgeIdx total_edge = randomEdgeCollection.edge_list.size();

    for (VertexIdx i=0; i<total_edge; i=i+sparsity) {
        EdgeInfo e_struct;
        VertexIdx parent,child;
        parent = randomEdgeCollection.edge_list[i].u;
        child = randomEdgeCollection.edge_list[i].v;

        e_struct.index = randomEdgeCollection.edge_list[i].index;
        e_struct.src = parent;
        e_struct.dest = child;
        running_count += TriangleByEdge(cg,e_struct);
        no_of_samples++;
        /**
         * Now for the vertex with lesser degree, we visit all of its neighbors
         * and all the incident edges on it we copy the lower degree vertex in src.
         * Update relevant data structure and also update query complexity
         */
        VertexIdx src,dst;
        if (cg->degree(parent) > cg-> degree(child)) {
            src = child;
            dst = parent;
        }
        else {
            src = parent;
            dst = child;
        }
        for (EdgeIdx idx = cg->offsets[src]; idx <cg->offsets[src+1];idx++ ) {
            randomEdgeCollection.visited_vertex_set[cg->nbors[idx]] = true;
            randomEdgeCollection.visited_edge_set[idx] = true;
            EdgeIdx e2 = cg->getEdgeBinary(cg->nbors[idx],dst);
            if (e2!= -1) {
                randomEdgeCollection.visited_edge_set[e2] = true;
            }
            randomEdgeCollection.no_of_query = randomEdgeCollection.no_of_query + 2;
        }
    }



    double scale = 1.0* edge_estimate / (6.0*no_of_samples);
    double triangleEstimate = running_count * scale ;
    //printf("p=%lf,  scale = %lf \n",p,scale);
//    printf ("Multi: %lld,  %lf\n",visited_edge_set.size(),triangleEstimate);

    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(randomEdgeCollection.visited_edge_set.begin(),randomEdgeCollection.visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(randomEdgeCollection.visited_vertex_set.begin(),randomEdgeCollection.visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / cg->nVertices;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / cg->nEdges;
    return_estimate.query_complexity = randomEdgeCollection.no_of_query * 100.0 /cg->nEdges;

    //    return_estimate.fraction_of_vertices_seen = visited_with_nbor_vertex_set.size() * 100.0 / n;
//    return_estimate.fraction_of_edges_seen = visited_with_nbor_edge_set.size() * 100.0 / m;
    // Why the multiplication by 2? The fraction of edges seen is effectively
    // compared against all the entries in the adjacency list, which is 2m.

    return return_estimate;
}